

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O3

void __thiscall OpenMD::Molecule::addTorsion(Molecule *this,Torsion *torsion)

{
  pointer *pppTVar1;
  iterator __position;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  _Var2;
  Torsion *local_10;
  
  local_10 = torsion;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Torsion**,std::vector<OpenMD::Torsion*,std::allocator<OpenMD::Torsion*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Torsion*const>>
                    ((this->torsions_).
                     super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->torsions_).
                     super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::Torsion*,std::allocator<OpenMD::Torsion*>>::
      _M_realloc_insert<OpenMD::Torsion*const&>
                ((vector<OpenMD::Torsion*,std::allocator<OpenMD::Torsion*>> *)&this->torsions_,
                 __position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppTVar1 = &(this->torsions_).
                  super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addTorsion(Torsion* torsion) {
    if (std::find(torsions_.begin(), torsions_.end(), torsion) ==
        torsions_.end()) {
      torsions_.push_back(torsion);
    }
  }